

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filereader.cpp
# Opt level: O2

Filereader * Filereader::getFilereader(HighsLogOptions *log_options,string *filename)

{
  bool bVar1;
  int iVar2;
  Filereader *pFVar3;
  undefined *puVar4;
  size_type sVar5;
  string lower_case_extension;
  string extension;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)filename);
  getFilenameExt(&extension,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = std::operator==(&extension,"gz");
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_60,(ulong)filename);
    getFilenameExt(&lower_case_extension,&local_60);
    std::__cxx11::string::_M_assign((string *)&extension);
    std::__cxx11::string::~string((string *)&lower_case_extension);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::string((string *)&lower_case_extension,(string *)&extension);
  for (sVar5 = 0; lower_case_extension._M_string_length != sVar5; sVar5 = sVar5 + 1) {
    iVar2 = tolower((uint)(byte)lower_case_extension._M_dataplus._M_p[sVar5]);
    lower_case_extension._M_dataplus._M_p[sVar5] = (char)iVar2;
  }
  iVar2 = std::__cxx11::string::compare((char *)&lower_case_extension);
  if (iVar2 == 0) {
    pFVar3 = (Filereader *)operator_new(8);
    puVar4 = &FilereaderMps::vtable;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&lower_case_extension);
    if (iVar2 == 0) {
      pFVar3 = (Filereader *)operator_new(0x10);
      pFVar3->_vptr_Filereader = (_func_int **)0x0;
      pFVar3[1]._vptr_Filereader = (_func_int **)0x0;
      puVar4 = &FilereaderLp::vtable;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&lower_case_extension);
      if (iVar2 != 0) {
        pFVar3 = (Filereader *)0x0;
        goto LAB_0021ba08;
      }
      pFVar3 = (Filereader *)operator_new(8);
      puVar4 = &FilereaderEms::vtable;
    }
  }
  pFVar3->_vptr_Filereader = (_func_int **)(puVar4 + 0x10);
LAB_0021ba08:
  std::__cxx11::string::~string((string *)&lower_case_extension);
  std::__cxx11::string::~string((string *)&extension);
  return pFVar3;
}

Assistant:

Filereader* Filereader::getFilereader(const HighsLogOptions& log_options,
                                      const std::string filename) {
  Filereader* reader;
  std::string extension = getFilenameExt(filename);
  if (extension == "gz") {
#ifdef ZLIB_FOUND
    extension = getFilenameExt(filename.substr(0, filename.size() - 3));
#else
    highsLogUser(log_options, HighsLogType::kError,
                 "HiGHS build without zlib support. Cannot read .gz file.\n",
                 filename.c_str());
    reader = NULL;
#endif
    //  } else if (extension == "zip") {
    // #ifdef ZLIB_FOUND
    //    extension = getFilenameExt(filename.substr(0, filename.size() - 4));
    // #else
    //    highsLogUser(log_options, HighsLogType::kError,
    //                 "HiGHS build without zlib support. Cannot read .zip
    //                 file.\n", filename.c_str());
    //    reader = NULL;
    // #endif
  }
  std::string lower_case_extension = extension;
  tolower(lower_case_extension);
  if (lower_case_extension.compare("mps") == 0) {
    reader = new FilereaderMps();
  } else if (lower_case_extension.compare("lp") == 0) {
    reader = new FilereaderLp();
  } else if (lower_case_extension.compare("ems") == 0) {
    reader = new FilereaderEms();
  } else {
    reader = NULL;
  }
  return reader;
}